

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.hpp
# Opt level: O0

Tensor<2> *
Omega_h::average_metric_finish<2>
          (Tensor<2> *__return_storage_ptr__,Tensor<2> am,Int n,bool has_degen)

{
  Tensor<2> log_m;
  bool has_degen_local;
  Int n_local;
  double local_f8;
  Matrix<2,_2> c;
  double local_c8 [4];
  double local_a8;
  double local_a0;
  int local_84;
  double dStack_80;
  Int j;
  int local_74;
  double *local_70;
  int local_64;
  double *local_60;
  int local_54;
  double dStack_50;
  Int i;
  double local_48 [3];
  Vector<2> c_1;
  
  if ((has_degen) && (n == 0)) {
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_
    [0] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[0].super_Few<double,_2>.array_
    [1] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_
    [0] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    (__return_storage_ptr__->super_Few<Omega_h::Vector<2>,_2>).array_[1].super_Few<double,_2>.array_
    [1] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  }
  else {
    c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = (double)n;
    local_c8[0] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_c8[1] = am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_c8[2] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_c8[3] = am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
      local_64 = local_84;
      local_60 = local_c8;
      local_a8 = local_60[(long)local_84 * 2];
      local_a0 = local_c8[(long)local_84 * 2 + 1];
      for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
        c_1.super_Few<double,_2>.array_[1]._4_4_ = local_54;
        c_1.super_Few<double,_2>.array_[(long)local_54 + -1] =
             local_48[local_54] /
             c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      }
      local_74 = local_84;
      local_70 = &local_f8;
      local_70[(long)local_84 * 2] = local_48[2];
      c.super_Few<Omega_h::Vector<2>,_2>.array_[local_84].super_Few<double,_2>.array_[0] =
           c_1.super_Few<double,_2>.array_[0];
      dStack_50 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      local_48[0] = local_a8;
      local_48[1] = local_a0;
    }
    am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
         c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] = local_f8;
    am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
         c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
         c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    log_m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
         (double)__return_storage_ptr__;
    log_m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
         am.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    log_m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
         am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    log_m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
         am.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    dStack_80 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
    delinearize_metric<2>(log_m);
  }
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> average_metric_finish(
    Tensor<dim> am, Int const n, bool const has_degen) {
  if (has_degen && n == 0) return am;
  am /= n;
  return delinearize_metric(am);
}